

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O0

bool __thiscall TTD::FileReader::ReadRawChar(FileReader *this,char16 *c)

{
  char16 *c_local;
  FileReader *this_local;
  
  if (this->m_peekChar == -1) {
    if (this->m_cursor == this->m_buffCount) {
      ReadBlock(this,this->m_buffer,&this->m_buffCount);
      this->m_cursor = 0;
    }
    if (this->m_cursor == this->m_buffCount) {
      *c = L'\0';
      this_local._7_1_ = false;
    }
    else {
      *c = *(char16 *)(this->m_buffer + this->m_cursor);
      this->m_cursor = this->m_cursor + 2;
      this_local._7_1_ = true;
    }
  }
  else {
    *c = (char16)this->m_peekChar;
    this->m_peekChar = -1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ReadRawChar(_Out_ char16* c)
        {
            if(this->m_peekChar != -1)
            {
                *c = (char16)this->m_peekChar;
                this->m_peekChar = -1;

                return true;
            }
            else
            {
                if(this->m_cursor == this->m_buffCount)
                {
                    this->ReadBlock(this->m_buffer, &this->m_buffCount);
                    this->m_cursor = 0;
                }

                if(this->m_cursor == this->m_buffCount)
                {
                    // Make sure to set a value before we return.
                    *c = _u('\0');

                    return false;
                }
                else
                {
                    *c = *((char16*)(this->m_buffer + this->m_cursor));
                    this->m_cursor += sizeof(char16);

                    return true;
                }
            }
        }